

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O2

Vec_Int_t * Wla_ManCollectNodes(Wla_Man_t *pWla,int fBlack)

{
  int i;
  int iVar1;
  Vec_Int_t *p;
  int i_00;
  
  if (pWla->vSignals != (Vec_Int_t *)0x0) {
    p = Vec_IntAlloc(100);
    for (i_00 = 0; i_00 < pWla->vSignals->nSize; i_00 = i_00 + 1) {
      i = Vec_IntEntry(pWla->vSignals,i_00);
      iVar1 = Vec_BitEntry(pWla->vUnmark,i);
      if ((fBlack == 0) != (iVar1 == 0)) {
        Vec_IntPush(p,i);
      }
    }
    return p;
  }
  __assert_fail("pWla->vSignals",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcAbs.c"
                ,0x537,"Vec_Int_t *Wla_ManCollectNodes(Wla_Man_t *, int)");
}

Assistant:

Vec_Int_t * Wla_ManCollectNodes( Wla_Man_t * pWla, int fBlack )
{
    Vec_Int_t * vNodes = NULL;
    int i, Entry;

    assert( pWla->vSignals );

    vNodes = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( pWla->vSignals, Entry, i )
    {
        if ( !fBlack && Vec_BitEntry(pWla->vUnmark, Entry) )
            Vec_IntPush( vNodes, Entry );
        
        if ( fBlack && !Vec_BitEntry(pWla->vUnmark, Entry) )
            Vec_IntPush( vNodes, Entry );
    }

    return vNodes;
}